

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_regexp_Symbol_split(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue val_02;
  JSValue val_03;
  JSValue func_obj;
  JSValue this_obj;
  JSValue val_04;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue obj;
  JSValue obj_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int64_t iVar4;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar5;
  int64_t i;
  int64_t numberOfCaptures;
  int64_t e;
  int64_t lengthA;
  int unicodeMatching;
  uint32_t q;
  uint32_t p;
  uint32_t size;
  uint32_t lim;
  JSString *strp;
  JSValue sub;
  JSValue z;
  JSValue flags;
  JSValue A;
  JSValue splitter;
  JSValue ctor;
  JSValue str;
  JSValue args [2];
  JSValue rx;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 uVar6;
  JSAtom in_stack_fffffffffffffcfc;
  JSContext *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  JSContext *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  int in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  JSValue in_stack_fffffffffffffd28;
  JSValue in_stack_fffffffffffffd38;
  JSValue in_stack_fffffffffffffd48;
  JSValue in_stack_fffffffffffffd58;
  JSValueUnion local_258;
  JSValueUnion local_218;
  JSValueUnion local_1f8;
  JSAtom in_stack_fffffffffffffe4c;
  JSContext *ctx_00;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe5c;
  int64_t iVar8;
  JSValueUnion in_stack_fffffffffffffe68;
  long in_stack_fffffffffffffe70;
  ulong local_188;
  ulong local_180;
  uint local_170;
  uint local_16c;
  uint local_164;
  JSValueUnion local_128;
  int64_t local_120;
  BOOL BVar9;
  JSValueUnion local_90;
  int64_t local_88;
  
  JVar5.tag = in_RDX;
  JVar5.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar5);
  if (iVar1 == 0) {
    JVar5 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x174335);
    return JVar5;
  }
  uVar7 = 0;
  iVar8 = 3;
  ctx_00 = (JSContext *)0x3;
  BVar9 = 3;
  val.u._4_4_ = in_stack_fffffffffffffcfc;
  val.u.int32 = in_stack_fffffffffffffcf8;
  val.tag = (int64_t)in_stack_fffffffffffffd00;
  JVar5 = JS_ToString((JSContext *)0x174479,val);
  local_1f8 = JVar5.u;
  iVar1 = JS_IsException(JVar5);
  if (iVar1 == 0) {
    JVar5 = JS_SpeciesConstructor
                      ((JSContext *)in_stack_fffffffffffffd38.tag,in_stack_fffffffffffffd58,
                       in_stack_fffffffffffffd48);
    iVar1 = JS_IsException(JVar5);
    if (iVar1 == 0) {
      uVar6 = 0;
      obj.tag = in_stack_fffffffffffffe70;
      obj.u.float64 = in_stack_fffffffffffffe68.float64;
      this_obj_00.u._4_4_ = in_stack_fffffffffffffe5c;
      this_obj_00.u.int32 = uVar7;
      this_obj_00.tag = iVar8;
      in_stack_fffffffffffffd10 = in_RDI;
      JS_GetPropertyInternal(ctx_00,obj,in_stack_fffffffffffffe4c,this_obj_00,BVar9);
      val_02.tag._0_4_ = in_stack_fffffffffffffd18;
      val_02.u = (JSValueUnion)in_stack_fffffffffffffd10;
      val_02.tag._4_4_ = in_stack_fffffffffffffd1c;
      JVar5 = JS_ToStringFree((JSContext *)
                              CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),val_02);
      local_218 = JVar5.u;
      iVar1 = JS_IsException(JVar5);
      if (iVar1 == 0) {
        string_indexof_char((JSString *)local_218.ptr,0x75,0);
        iVar1 = string_indexof_char((JSString *)local_218.ptr,0x79,0);
        if (iVar1 < 0) {
          JVar5 = JS_ConcatString3((JSContext *)in_stack_fffffffffffffd48.tag,
                                   (char *)in_stack_fffffffffffffd48.u.ptr,in_stack_fffffffffffffd58
                                   ,(char *)in_stack_fffffffffffffd38.tag);
          iVar1 = JS_IsException(JVar5);
          if (iVar1 != 0) goto LAB_00174f70;
        }
        func_obj.u._4_4_ = in_stack_fffffffffffffd1c;
        func_obj.u.int32 = in_stack_fffffffffffffd18;
        func_obj.tag._0_4_ = in_stack_fffffffffffffd20;
        func_obj.tag._4_4_ = in_stack_fffffffffffffd24;
        JVar5 = JS_CallConstructor(in_stack_fffffffffffffd10,func_obj,in_stack_fffffffffffffd0c,
                                   (JSValue *)in_stack_fffffffffffffd00);
        BVar9 = (BOOL)JVar5.tag;
        iVar1 = JS_IsException(JVar5);
        if (iVar1 == 0) {
          JVar5 = JS_NewArray(in_stack_fffffffffffffd00);
          local_258 = JVar5.u;
          local_128 = local_258;
          local_120 = JVar5.tag;
          iVar1 = JS_IsException(JVar5);
          if (iVar1 == 0) {
            local_180 = 0;
            iVar1 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10));
            if (iVar1 == 0) {
              val_00.u._4_4_ = in_stack_fffffffffffffd0c;
              val_00.u.int32 = in_stack_fffffffffffffd08;
              val_00.tag = (int64_t)in_stack_fffffffffffffd10;
              iVar1 = JS_ToUint32(in_stack_fffffffffffffd00,
                                  (uint32_t *)CONCAT44(in_stack_fffffffffffffcfc,uVar6),val_00);
              if (iVar1 < 0) goto LAB_00174f70;
              if (local_164 == 0) goto LAB_00174fb8;
            }
            else {
              local_164 = 0xffffffff;
            }
            local_170 = 0;
            local_16c = 0;
            uVar2 = (uint)*(ulong *)((long)local_1f8.ptr + 4) & 0x7fffffff;
            iVar1 = (int)JVar5.tag;
            if ((*(ulong *)((long)local_1f8.ptr + 4) & 0x7fffffff) == 0) {
              JVar5 = JS_RegExpExec((JSContext *)in_stack_fffffffffffffd38.tag,
                                    in_stack_fffffffffffffd58,in_stack_fffffffffffffd48);
              iVar3 = JS_IsException(JVar5);
              if (iVar3 != 0) goto LAB_00174f70;
              iVar3 = JS_IsNull(JVar5);
              if (iVar3 == 0) goto LAB_00174fb8;
            }
            else {
              while (local_170 < uVar2) {
                this_obj.u._4_4_ = in_stack_fffffffffffffd1c;
                this_obj.u.int32 = in_stack_fffffffffffffd18;
                this_obj.tag._0_4_ = in_stack_fffffffffffffd20;
                this_obj.tag._4_4_ = in_stack_fffffffffffffd24;
                val_01.u._4_4_ = in_stack_fffffffffffffd0c;
                val_01.u.int32 = in_stack_fffffffffffffd08;
                val_01.tag = (int64_t)in_stack_fffffffffffffd10;
                iVar3 = JS_SetProperty(in_stack_fffffffffffffd00,this_obj,in_stack_fffffffffffffcfc,
                                       val_01);
                if (iVar3 < 0) goto LAB_00174f70;
                v.u._4_4_ = in_stack_fffffffffffffd0c;
                v.u.int32 = in_stack_fffffffffffffd08;
                v.tag = (int64_t)in_stack_fffffffffffffd10;
                JS_FreeValue(in_stack_fffffffffffffd00,v);
                JVar5 = JS_RegExpExec((JSContext *)in_stack_fffffffffffffd38.tag,
                                      in_stack_fffffffffffffd58,in_stack_fffffffffffffd48);
                iVar3 = JS_IsException(JVar5);
                if (iVar3 != 0) goto LAB_00174f70;
                iVar3 = JS_IsNull(JVar5);
                if (iVar3 == 0) {
                  in_stack_fffffffffffffd08 = SUB84(in_RDI,0);
                  in_stack_fffffffffffffd0c = (int)((ulong)in_RDI >> 0x20);
                  uVar6 = 0;
                  obj_00.tag = in_stack_fffffffffffffe70;
                  obj_00.u.float64 = in_stack_fffffffffffffe68.float64;
                  this_obj_01.u._4_4_ = in_stack_fffffffffffffe5c;
                  this_obj_01.u.int32 = uVar7;
                  this_obj_01.tag = iVar8;
                  JS_GetPropertyInternal(ctx_00,obj_00,in_stack_fffffffffffffe4c,this_obj_01,BVar9);
                  val_04.u._4_4_ = in_stack_fffffffffffffd1c;
                  val_04.u.int32 = in_stack_fffffffffffffd18;
                  val_04.tag._0_4_ = in_stack_fffffffffffffd20;
                  val_04.tag._4_4_ = in_stack_fffffffffffffd24;
                  iVar3 = JS_ToLengthFree(in_stack_fffffffffffffd10,
                                          (int64_t *)
                                          CONCAT44(in_stack_fffffffffffffd0c,
                                                   in_stack_fffffffffffffd08),val_04);
                  if (iVar3 != 0) goto LAB_00174f70;
                  if ((long)(ulong)uVar2 < (long)local_188) {
                    local_188 = (ulong)uVar2;
                  }
                  if (local_188 == local_16c) {
                    iVar4 = string_advance_index
                                      ((JSString *)in_stack_fffffffffffffd00,
                                       CONCAT44(in_stack_fffffffffffffcfc,uVar6),0);
                    local_170 = (uint)iVar4;
                  }
                  else {
                    in_stack_fffffffffffffd58 =
                         js_sub_string((JSContext *)in_stack_fffffffffffffd28.tag,
                                       (JSString *)in_stack_fffffffffffffd28.u.ptr,
                                       in_stack_fffffffffffffd24,in_stack_fffffffffffffd20);
                    iVar3 = JS_IsException(in_stack_fffffffffffffd58);
                    if (iVar3 != 0) goto LAB_00174f70;
                    local_180 = local_180 + 1;
                    uVar6 = 0x4007;
                    iVar3 = JS_DefinePropertyValueInt64
                                      ((JSContext *)
                                       CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                                       ,in_stack_fffffffffffffd38,
                                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                                       ,in_stack_fffffffffffffd28,iVar1);
                    if (iVar3 < 0) goto LAB_00174f70;
                    if (local_180 == local_164) goto LAB_00174fb8;
                    local_170 = (uint)local_188;
                    iVar3 = js_get_length64((JSContext *)
                                            CONCAT44(in_stack_fffffffffffffd24,
                                                     in_stack_fffffffffffffd20),
                                            (int64_t *)
                                            CONCAT44(in_stack_fffffffffffffd1c,
                                                     in_stack_fffffffffffffd18),
                                            in_stack_fffffffffffffd28);
                    if (iVar3 != 0) goto LAB_00174f70;
                    for (in_stack_fffffffffffffe68.float64 = 4.94065645841247e-324;
                        local_16c = local_170,
                        (long)in_stack_fffffffffffffe68.ptr < in_stack_fffffffffffffe70;
                        in_stack_fffffffffffffe68.float64 = in_stack_fffffffffffffe68.float64 + 1) {
                      in_stack_fffffffffffffd00 = in_RDI;
                      in_stack_fffffffffffffd38 =
                           JS_GetPropertyInt64((JSContext *)in_stack_fffffffffffffd38.tag,
                                               in_stack_fffffffffffffd48,
                                               (int64_t)in_stack_fffffffffffffd38.u);
                      val_03.tag._0_4_ = in_stack_fffffffffffffd18;
                      val_03.u.ptr = in_stack_fffffffffffffd10;
                      val_03.tag._4_4_ = in_stack_fffffffffffffd1c;
                      in_stack_fffffffffffffd48 =
                           JS_ToStringFree((JSContext *)
                                           CONCAT44(in_stack_fffffffffffffd0c,
                                                    in_stack_fffffffffffffd08),val_03);
                      iVar3 = JS_IsException(in_stack_fffffffffffffd48);
                      if (iVar3 != 0) goto LAB_00174f70;
                      local_180 = local_180 + 1;
                      uVar6 = 0x4007;
                      iVar3 = JS_DefinePropertyValueInt64
                                        ((JSContext *)
                                         CONCAT44(in_stack_fffffffffffffd24,
                                                  in_stack_fffffffffffffd20),
                                         in_stack_fffffffffffffd38,
                                         CONCAT44(in_stack_fffffffffffffd1c,
                                                  in_stack_fffffffffffffd18),
                                         in_stack_fffffffffffffd28,iVar1);
                      if (iVar3 < 0) goto LAB_00174f70;
                      if (local_180 == local_164) goto LAB_00174fb8;
                    }
                  }
                }
                else {
                  iVar4 = string_advance_index
                                    ((JSString *)in_stack_fffffffffffffd00,
                                     CONCAT44(in_stack_fffffffffffffcfc,uVar6),0);
                  local_170 = (uint)iVar4;
                }
              }
            }
            JVar5 = js_sub_string((JSContext *)in_stack_fffffffffffffd28.tag,
                                  (JSString *)in_stack_fffffffffffffd28.u.ptr,
                                  in_stack_fffffffffffffd24,in_stack_fffffffffffffd20);
            iVar3 = JS_IsException(JVar5);
            if ((iVar3 == 0) &&
               (iVar1 = JS_DefinePropertyValueInt64
                                  ((JSContext *)
                                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                   in_stack_fffffffffffffd38,
                                   CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                                   JVar5,iVar1), -1 < iVar1)) goto LAB_00174fb8;
          }
        }
      }
    }
  }
LAB_00174f70:
  v_00.u._4_4_ = in_stack_fffffffffffffd0c;
  v_00.u.int32 = in_stack_fffffffffffffd08;
  v_00.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_00);
  local_128.ptr = (void *)((ulong)in_stack_fffffffffffffd1c << 0x20);
  local_120 = 6;
LAB_00174fb8:
  v_01.u._4_4_ = in_stack_fffffffffffffd0c;
  v_01.u.int32 = in_stack_fffffffffffffd08;
  v_01.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_01);
  v_02.u._4_4_ = in_stack_fffffffffffffd0c;
  v_02.u.int32 = in_stack_fffffffffffffd08;
  v_02.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_02);
  v_03.u._4_4_ = in_stack_fffffffffffffd0c;
  v_03.u.int32 = in_stack_fffffffffffffd08;
  v_03.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_03);
  v_04.u._4_4_ = in_stack_fffffffffffffd0c;
  v_04.u.int32 = in_stack_fffffffffffffd08;
  v_04.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_04);
  v_05.u._4_4_ = in_stack_fffffffffffffd0c;
  v_05.u.int32 = in_stack_fffffffffffffd08;
  v_05.tag = (int64_t)in_stack_fffffffffffffd10;
  JS_FreeValue(in_stack_fffffffffffffd00,v_05);
  local_88 = local_120;
  local_90.ptr = local_128.ptr;
  return _local_90;
}

Assistant:

static JSValue js_regexp_Symbol_split(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    // [Symbol.split](str, limit)
    JSValueConst rx = this_val;
    JSValueConst args[2];
    JSValue str, ctor, splitter, A, flags, z, sub;
    JSString *strp;
    uint32_t lim, size, p, q;
    int unicodeMatching;
    int64_t lengthA, e, numberOfCaptures, i;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    ctor = JS_UNDEFINED;
    splitter = JS_UNDEFINED;
    A = JS_UNDEFINED;
    flags = JS_UNDEFINED;
    z = JS_UNDEFINED;
    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
    ctor = JS_SpeciesConstructor(ctx, rx, ctx->regexp_ctor);
    if (JS_IsException(ctor))
        goto exception;
    flags = JS_ToStringFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_flags));
    if (JS_IsException(flags))
        goto exception;
    strp = JS_VALUE_GET_STRING(flags);
    unicodeMatching = string_indexof_char(strp, 'u', 0) >= 0;
    if (string_indexof_char(strp, 'y', 0) < 0) {
        flags = JS_ConcatString3(ctx, "", flags, "y");
        if (JS_IsException(flags))
            goto exception;
    }
    args[0] = rx;
    args[1] = flags;
    splitter = JS_CallConstructor(ctx, ctor, 2, args);
    if (JS_IsException(splitter))
        goto exception;
    A = JS_NewArray(ctx);
    if (JS_IsException(A))
        goto exception;
    lengthA = 0;
    if (JS_IsUndefined(argv[1])) {
        lim = 0xffffffff;
    } else {
        if (JS_ToUint32(ctx, &lim, argv[1]) < 0)
            goto exception;
        if (lim == 0)
            goto done;
    }
    strp = JS_VALUE_GET_STRING(str);
    p = q = 0;
    size = strp->len;
    if (size == 0) {
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z))
            goto add_tail;
        goto done;
    }
    while (q < size) {
        if (JS_SetProperty(ctx, splitter, JS_ATOM_lastIndex, JS_NewInt32(ctx, q)) < 0)
            goto exception;
        JS_FreeValue(ctx, z);    
        z = JS_RegExpExec(ctx, splitter, str);
        if (JS_IsException(z))
            goto exception;
        if (JS_IsNull(z)) {
            q = string_advance_index(strp, q, unicodeMatching);
        } else {
            if (JS_ToLengthFree(ctx, &e, JS_GetProperty(ctx, splitter, JS_ATOM_lastIndex)))
                goto exception;
            if (e > size)
                e = size;
            if (e == p) {
                q = string_advance_index(strp, q, unicodeMatching);
            } else {
                sub = js_sub_string(ctx, strp, p, q);
                if (JS_IsException(sub))
                    goto exception;
                if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                if (lengthA == lim)
                    goto done;
                p = e;
                if (js_get_length64(ctx, &numberOfCaptures, z))
                    goto exception;
                for(i = 1; i < numberOfCaptures; i++) {
                    sub = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, z, i));
                    if (JS_IsException(sub))
                        goto exception;
                    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                    if (lengthA == lim)
                        goto done;
                }
                q = p;
            }
        }
    }
add_tail:
    if (p > size)
        p = size;
    sub = js_sub_string(ctx, strp, p, size);
    if (JS_IsException(sub))
        goto exception;
    if (JS_DefinePropertyValueInt64(ctx, A, lengthA++, sub, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
        goto exception;
    goto done;
exception:
    JS_FreeValue(ctx, A);
    A = JS_EXCEPTION;
done:
    JS_FreeValue(ctx, str);
    JS_FreeValue(ctx, ctor);
    JS_FreeValue(ctx, splitter);
    JS_FreeValue(ctx, flags);
    JS_FreeValue(ctx, z);    
    return A;
}